

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int main(void)

{
  int iVar1;
  nn_list_item *pnVar2;
  item *item;
  nn_list_item *list_item;
  nn_list list;
  int rc;
  
  list.last._4_4_ = 0;
  nn_list_item_init(&that.item);
  iVar1 = nn_list_item_isinlist(&that.item);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_list_item_isinlist (&that.item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x33);
    fflush(_stderr);
    nn_err_abort();
  }
  that.item.prev = &sentinel;
  that.item.next = &sentinel;
  iVar1 = nn_list_item_isinlist(&that.item);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_item_isinlist (&that.item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x38);
    fflush(_stderr);
    nn_err_abort();
  }
  that.item.prev = (nn_list_item *)0x0;
  that.item.next = (nn_list_item *)0x0;
  iVar1 = nn_list_item_isinlist(&that.item);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_item_isinlist (&that.item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x3b);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_item_init(&that.item);
  nn_list_item_term(&that.item);
  list_item = &sentinel;
  list.first = &sentinel;
  nn_list_init((nn_list *)&list_item);
  if (list_item != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list.first == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x49);
    fflush(_stderr);
    nn_err_abort();
  }
  if (list.first != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list.last == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x4a);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)&list_item);
  nn_list_init((nn_list *)&list_item);
  list.last._0_4_ = nn_list_empty((nn_list *)&list_item);
  if ((int)list.last != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x53);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_begin((nn_list *)&list_item);
  if (pnVar2 != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x56);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_end((nn_list *)&list_item);
  if (pnVar2 != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x59);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)&list_item);
  nn_list_init((nn_list *)&list_item);
  nn_list_item_init(&that.item);
  iVar1 = nn_list_item_isinlist(&that.item);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_list_item_isinlist (&that.item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            99);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_end((nn_list *)&list_item);
  nn_list_insert((nn_list *)&list_item,&that.item,pnVar2);
  iVar1 = nn_list_item_isinlist(&that.item);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_item_isinlist (&that.item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x68);
    fflush(_stderr);
    nn_err_abort();
  }
  if (that.item.prev != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","that.item.prev == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x6b);
    fflush(_stderr);
    nn_err_abort();
  }
  if (that.item.next != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","that.item.next == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x6c);
    fflush(_stderr);
    nn_err_abort();
  }
  if (list_item != &that.item) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list.first == &that.item",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x6f);
    fflush(_stderr);
    nn_err_abort();
  }
  if (list.first != &that.item) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list.last == &that.item",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x70);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_erase((nn_list *)&list_item,&that.item);
  iVar1 = nn_list_item_isinlist(&that.item);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_list_item_isinlist (&that.item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x74);
    fflush(_stderr);
    nn_err_abort();
  }
  if (list_item != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list.first == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x76);
    fflush(_stderr);
    nn_err_abort();
  }
  if (list.first != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list.last == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x77);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_item_term(&that.item);
  nn_list_term((nn_list *)&list_item);
  nn_list_init((nn_list *)&list_item);
  nn_list_item_init(&that.item);
  pnVar2 = nn_list_end((nn_list *)&list_item);
  nn_list_insert((nn_list *)&list_item,&that.item,pnVar2);
  pnVar2 = nn_list_begin((nn_list *)&list_item);
  if (pnVar2 != &that.item) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == &that.item",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x84);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_end((nn_list *)&list_item);
  if (pnVar2 != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x8a);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_prev((nn_list *)&list_item,&that.item);
  if (pnVar2 != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x8d);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_next((nn_list *)&list_item,&that.item);
  if (pnVar2 != (nn_list_item *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x90);
    fflush(_stderr);
    nn_err_abort();
  }
  list.last._0_4_ = nn_list_empty((nn_list *)&list_item);
  if ((int)list.last != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0x93);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_erase((nn_list *)&list_item,&that.item);
  nn_list_item_term(&that.item);
  nn_list_term((nn_list *)&list_item);
  nn_list_init((nn_list *)&list_item);
  nn_list_item_init(&that.item);
  nn_list_item_init(&other.item);
  pnVar2 = nn_list_end((nn_list *)&list_item);
  nn_list_insert((nn_list *)&list_item,&that.item,pnVar2);
  pnVar2 = nn_list_end((nn_list *)&list_item);
  nn_list_insert((nn_list *)&list_item,&other.item,pnVar2);
  pnVar2 = nn_list_begin((nn_list *)&list_item);
  if (pnVar2 != &that.item) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == &that.item",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
            0xa3);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar2 = nn_list_next((nn_list *)&list_item,&that.item);
  if (pnVar2 == &other.item) {
    nn_list_erase((nn_list *)&list_item,&that.item);
    nn_list_erase((nn_list *)&list_item,&other.item);
    nn_list_item_term(&that.item);
    nn_list_item_term(&other.item);
    nn_list_term((nn_list *)&list_item);
    nn_list_init((nn_list *)&list_item);
    nn_list_item_init(&that.item);
    nn_list_item_init(&other.item);
    pnVar2 = nn_list_begin((nn_list *)&list_item);
    nn_list_insert((nn_list *)&list_item,&that.item,pnVar2);
    pnVar2 = nn_list_begin((nn_list *)&list_item);
    nn_list_insert((nn_list *)&list_item,&other.item,pnVar2);
    pnVar2 = nn_list_begin((nn_list *)&list_item);
    if (pnVar2 != &other.item) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == &other.item",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c"
              ,0xb8);
      fflush(_stderr);
      nn_err_abort();
    }
    pnVar2 = nn_list_next((nn_list *)&list_item,&other.item);
    if (pnVar2 != &that.item) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == &that.item",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c"
              ,0xbb);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)&list_item,&that.item);
    nn_list_erase((nn_list *)&list_item,&other.item);
    nn_list_item_term(&that.item);
    nn_list_item_term(&other.item);
    nn_list_term((nn_list *)&list_item);
    return 0;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","list_item == &other.item",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
          0xa6);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    struct nn_list list;
    struct nn_list_item *list_item;
    struct item *item;

    /*  List item life cycle. */

    /*  Initialize the item. Make sure it's not part of any list. */
    nn_list_item_init (&that.item);
    nn_assert (!nn_list_item_isinlist (&that.item));

    /*  That may be part of some list, or uninitialized memory. */
    that.item.prev = &sentinel;
    that.item.next = &sentinel;
    nn_assert (nn_list_item_isinlist (&that.item));
    that.item.prev = NULL;
    that.item.next = NULL;
    nn_assert (nn_list_item_isinlist (&that.item));

    /*  Before termination, item must be removed from the list. */
    nn_list_item_init (&that.item);
    nn_list_item_term (&that.item);

    /*  Initializing a list. */

    /*  Uninitialized list has random content. */
    list.first = &sentinel;
    list.last = &sentinel;

    nn_list_init (&list);

    nn_assert (list.first == NULL);
    nn_assert (list.last == NULL);

    nn_list_term (&list);
    
    /*  Empty list. */
    
    nn_list_init (&list);

    rc = nn_list_empty (&list);
    nn_assert (rc == 1); 

    list_item = nn_list_begin (&list);
    nn_assert (list_item == NULL);

    list_item = nn_list_end (&list);
    nn_assert (list_item == NULL);

    nn_list_term (&list);

    /*  Inserting and erasing items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);

    /*  Item doesn'tt belong to list yet. */
    nn_assert (!nn_list_item_isinlist (&that.item));

    nn_list_insert (&list, &that.item, nn_list_end (&list));

    /*  Item is now part of a list. */
    nn_assert (nn_list_item_isinlist (&that.item));

    /*  Single item does not have prev or next item. */
    nn_assert (that.item.prev == NULL);
    nn_assert (that.item.next == NULL);

    /*  Item is both first and list item. */
    nn_assert (list.first == &that.item);
    nn_assert (list.last == &that.item);

    /*  Removing an item. */
    nn_list_erase (&list, &that.item);
    nn_assert (!nn_list_item_isinlist (&that.item));

    nn_assert (list.first == NULL);
    nn_assert (list.last == NULL);

    nn_list_item_term (&that.item);
    nn_list_term (&list);

    /*  Iterating items. */
    
    nn_list_init (&list);
    nn_list_item_init (&that.item);

    nn_list_insert (&list, &that.item, nn_list_end (&list));
    
    list_item = nn_list_begin (&list);
    nn_assert (list_item == &that.item);

    item = nn_cont (list_item, struct item, item);
    nn_assert (item == &that);

    list_item = nn_list_end (&list);
    nn_assert (list_item == NULL);

    list_item = nn_list_prev (&list, &that.item);
    nn_assert (list_item == NULL);

    list_item = nn_list_next (&list, &that.item);
    nn_assert (list_item == NULL);

    rc = nn_list_empty (&list);
    nn_assert (rc == 0);

    nn_list_erase (&list, &that.item);
    nn_list_item_term (&that.item);
    nn_list_term (&list);

    /*  Appending items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);
    nn_list_item_init (&other.item);

    nn_list_insert (&list, &that.item, nn_list_end (&list));
    nn_list_insert (&list, &other.item, nn_list_end (&list));

    list_item = nn_list_begin (&list);
    nn_assert (list_item == &that.item);

    list_item = nn_list_next (&list, list_item);
    nn_assert (list_item == &other.item);

    nn_list_erase (&list, &that.item);
    nn_list_erase (&list, &other.item);
    nn_list_item_term (&that.item);
    nn_list_item_term (&other.item);
    nn_list_term (&list);

    /*  Prepending items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);
    nn_list_item_init (&other.item);

    nn_list_insert (&list, &that.item, nn_list_begin (&list));
    nn_list_insert (&list, &other.item, nn_list_begin (&list));

    list_item = nn_list_begin (&list);
    nn_assert (list_item == &other.item);

    list_item = nn_list_next (&list, list_item);
    nn_assert (list_item == &that.item);

    nn_list_erase (&list, &that.item);
    nn_list_erase (&list, &other.item);
    nn_list_item_term (&that.item);
    nn_list_item_term (&other.item);
    nn_list_term (&list);

    return 0;
}